

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>::
TestBody(NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>
         *this)

{
  bool bVar1;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar2
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  char *pcVar3;
  char *in_R9;
  Cord *output;
  pointer *__ptr_1;
  pointer *__ptr;
  string_view data;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  AssertHelper local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  undefined1 local_240 [8];
  undefined1 local_238 [24];
  AssertHelper local_220;
  vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_218;
  AssertHelper local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [200];
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  undefined1 local_100 [32];
  Eq2Matcher local_e0 [184];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_100,(Arena *)0x0);
  pMVar2 = protobuf::internal::
           TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap((TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_100 + 0x10));
  local_240._0_4_ = 0;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)local_1f8,pMVar2,(int *)local_240);
  pcVar3 = anon_var_dwarf_a22956 + 5;
  pMVar2 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(anon_var_dwarf_a22956 + 5);
  std::__cxx11::string::_M_replace
            ((ulong)(local_1f8._0_8_ + 0x10),0,(char *)((NodeBase *)(local_1f8._0_8_ + 0x18))->next,
             0x10f75f1);
  output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
  bVar1 = MessageLite::SerializeToString((MessageLite *)local_100,output);
  local_240[0] = (internal)bVar1;
  local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    absl::lts_20250127::Cord::operator_cast_to_string((string *)local_1f8,output);
    local_240[0] = (internal)((UntypedMapBase *)local_1f8._8_8_ != (UntypedMapBase *)0x0);
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((NodeBase *)local_1f8._0_8_ == (NodeBase *)local_1e8) {
      if ((UntypedMapBase *)local_1f8._8_8_ != (UntypedMapBase *)0x0) goto LAB_008a04dc;
    }
    else {
      operator_delete((void *)local_1f8._0_8_,local_1e8._0_8_ + 1);
      if ((local_240._0_4_ & Superset) != 0) {
LAB_008a04dc:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238._0_8_);
        }
        proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
                  ((TestAllMapTypes *)local_1f8,(Arena *)0x0);
        absl::lts_20250127::Cord::operator_cast_to_string((string *)local_240,output);
        data._M_str._4_4_ = local_240._4_4_;
        data._M_str._0_4_ = local_240._0_4_;
        data._M_len = local_238._0_8_;
        bVar1 = MessageLite::ParseFromString((MessageLite *)local_1f8,data);
        local_220.data_._0_4_ = CONCAT31(local_220.data_._1_3_,bVar1);
        local_218.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if ((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_) == local_238 + 8) {
          if (!bVar1) goto LAB_008a055b;
        }
        else {
          operator_delete((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_),
                          local_238._8_8_ + 1);
          if (((Flags)local_220.data_ & 1) == 0) {
LAB_008a055b:
            testing::Message::Message((Message *)&local_250);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_240,(internal *)&local_220,
                       (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true"
                       ,in_R9);
            pMVar2 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x39f;
            testing::internal::AssertHelper::AssertHelper
                      (&local_200,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                       ,0x39f,(char *)CONCAT44(local_240._4_4_,local_240._0_4_));
            testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_250);
            testing::internal::AssertHelper::~AssertHelper(&local_200);
            if ((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_) != local_238 + 8) {
              operator_delete((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_),
                              local_238._8_8_ + 1);
            }
            if ((long *)CONCAT71(local_250.data_._1_7_,(char)local_250.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_250.data_._1_7_,(char)local_250.data_) + 8))();
            }
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_218.
            super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218.
                       super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        }
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                  ((MapFieldBase *)(local_100 + 0x10));
        testing::
        UnorderedPointwise<testing::internal::Eq2Matcher,google::protobuf::Map<int,std::__cxx11::string>>
                  (&local_120,(testing *)&local_200,local_e0,pMVar2);
        local_218.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_120.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_218.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_120.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_218.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_120.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_240._0_4_ = local_120.match_flags_;
        local_120.matchers_.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_120.matchers_.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_120.matchers_.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_220.data_._0_4_ = local_120.match_flags_;
        local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_238._8_8_ = 0;
        local_238._16_8_ = 0;
        std::
        vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector((vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_238);
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_1e8);
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,std::__cxx11::string>>>>
        ::operator()(&local_250,(char *)&local_220,
                     (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)"rt_msg.map_int32_bytes()");
        std::
        vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_218);
        std::
        vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_120.matchers_);
        if ((char)local_250.data_ == '\0') {
          testing::Message::Message((Message *)local_240);
          if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_220,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3a1,pcVar3);
          testing::internal::AssertHelper::operator=(&local_220,(Message *)local_240);
          testing::internal::AssertHelper::~AssertHelper(&local_220);
          if ((long *)CONCAT44(local_240._4_4_,local_240._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_240._4_4_,local_240._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_1e8);
        local_220.data_._0_4_ = 0;
        rhs = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::at<int>((Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_1e8 + 0x10),(key_arg<int> *)&local_220);
        pcVar3 = anon_var_dwarf_a22956 + 5;
        testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
                  ((internal *)local_240,"\"\"","rt_msg.map_int32_bytes().at(0)",
                   (char (*) [1])(anon_var_dwarf_a22956 + 5),rhs);
        if (local_240[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_220);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = ((_Alloc_hider *)local_238._0_8_)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3a5,pcVar3);
          testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_220);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          if ((long *)CONCAT44(local_220.data_._4_4_,(Flags)local_220.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_220.data_._4_4_,(Flags)local_220.data_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238._0_8_);
        }
        proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
                  ((TestAllMapTypes *)local_1f8);
        goto LAB_008a07e3;
      }
    }
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_240,
               (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x39b,(char *)local_1f8._0_8_);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((NodeBase *)local_1f8._0_8_ != (NodeBase *)local_1e8) {
      operator_delete((void *)local_1f8._0_8_,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_220.data_._4_4_,(Flags)local_220.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_220.data_._4_4_,(Flags)local_220.data_) + 8))();
    }
  }
  else {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_240,
               (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x399,(char *)local_1f8._0_8_);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((NodeBase *)local_1f8._0_8_ != (NodeBase *)local_1e8) {
      operator_delete((void *)local_1f8._0_8_,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_220.data_._4_4_,(Flags)local_220.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_220.data_._4_4_,(Flags)local_220.data_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_238._0_8_);
  }
LAB_008a07e3:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_100);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroString) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_bytes())[0] = "";

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_bytes(),
              UnorderedPointwise(Eq(), msg.map_int32_bytes()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ("", rt_msg.map_int32_bytes().at(0));
}